

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

void __thiscall tetgenmesh::transfernodes(tetgenmesh *this)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  int local_4c;
  int local_48;
  int j;
  int i;
  int mtrindex;
  int attribindex;
  int coordindex;
  double w;
  double z;
  double y;
  double x;
  point pointloop;
  tetgenmesh *this_local;
  
  mtrindex = 0;
  i = 0;
  j = 0;
  pointloop = (point)this;
  for (local_48 = 0; local_48 < this->in->numberofpoints; local_48 = local_48 + 1) {
    makepoint(this,(point *)&x,UNUSEDVERTEX);
    local_68 = this->in->pointlist[mtrindex];
    *(double *)x = local_68;
    iVar1 = mtrindex + 2;
    local_78 = this->in->pointlist[mtrindex + 1];
    *(double *)((long)x + 8) = local_78;
    mtrindex = mtrindex + 3;
    local_88 = this->in->pointlist[iVar1];
    *(double *)((long)x + 0x10) = local_88;
    for (local_4c = 0; local_4c < this->in->numberofpointattributes; local_4c = local_4c + 1) {
      *(double *)((long)x + (long)(local_4c + 3) * 8) = this->in->pointattributelist[i];
      i = i + 1;
    }
    for (local_4c = 0; local_4c < this->in->numberofpointmtrs; local_4c = local_4c + 1) {
      *(double *)((long)x + (long)(this->pointmtrindex + local_4c) * 8) = this->in->pointmtrlist[j];
      j = j + 1;
    }
    if (this->b->weighted != 0) {
      if (this->in->numberofpointattributes < 1) {
        _attribindex = ABS(local_68);
        if (_attribindex < ABS(local_78)) {
          _attribindex = ABS(local_78);
        }
        if (_attribindex < ABS(local_88)) {
          _attribindex = ABS(local_88);
        }
      }
      else {
        _attribindex = *(double *)((long)x + 0x18);
      }
      if (this->b->weighted_param == 0) {
        *(double *)((long)x + 0x18) =
             (local_88 * local_88 + local_68 * local_68 + local_78 * local_78) - _attribindex;
      }
      else {
        *(double *)((long)x + 0x18) = _attribindex;
      }
    }
    if (local_48 == 0) {
      this->xmax = local_68;
      this->xmin = local_68;
      this->ymax = local_78;
      this->ymin = local_78;
      this->zmax = local_88;
      this->zmin = local_88;
    }
    else {
      local_60 = local_68;
      if (this->xmin <= local_68) {
        local_60 = this->xmin;
      }
      this->xmin = local_60;
      if (local_68 < this->xmax || local_68 == this->xmax) {
        local_68 = this->xmax;
      }
      this->xmax = local_68;
      local_70 = local_78;
      if (this->ymin <= local_78) {
        local_70 = this->ymin;
      }
      this->ymin = local_70;
      if (local_78 < this->ymax || local_78 == this->ymax) {
        local_78 = this->ymax;
      }
      this->ymax = local_78;
      local_80 = local_88;
      if (this->zmin <= local_88) {
        local_80 = this->zmin;
      }
      this->zmin = local_80;
      if (local_88 < this->zmax || local_88 == this->zmax) {
        local_88 = this->zmax;
      }
      this->zmax = local_88;
    }
    if (this->b->psc != 0) {
      setpointgeomuv(this,(point)x,0,this->in->pointparamlist[local_48].uv[0]);
      setpointgeomuv(this,(point)x,1,this->in->pointparamlist[local_48].uv[1]);
      setpointgeomtag(this,(point)x,this->in->pointparamlist[local_48].tag);
      if (this->in->pointparamlist[local_48].type == 0) {
        setpointtype(this,(point)x,RIDGEVERTEX);
      }
      else if (this->in->pointparamlist[local_48].type == 1) {
        setpointtype(this,(point)x,FREESEGVERTEX);
      }
      else if (this->in->pointparamlist[local_48].type == 2) {
        setpointtype(this,(point)x,FREEFACETVERTEX);
      }
      else if (this->in->pointparamlist[local_48].type == 3) {
        setpointtype(this,(point)x,FREEVOLVERTEX);
      }
    }
  }
  dVar2 = this->xmax - this->xmin;
  dVar3 = this->ymax - this->ymin;
  dVar4 = this->zmax - this->zmin;
  dVar2 = sqrt(dVar4 * dVar4 + dVar2 * dVar2 + dVar3 * dVar3);
  this->longest = dVar2;
  if ((this->longest == 0.0) && (!NAN(this->longest))) {
    printf("Error:  The point set is trivial.\n");
    terminatetetgen(this,10);
  }
  this->minedgelength = this->longest * this->b->epsilon;
  return;
}

Assistant:

void tetgenmesh::transfernodes()
{
  point pointloop;
  REAL x, y, z, w;
  int coordindex;
  int attribindex;
  int mtrindex;
  int i, j;

  // Read the points.
  coordindex = 0;
  attribindex = 0;
  mtrindex = 0;
  for (i = 0; i < in->numberofpoints; i++) {
    makepoint(&pointloop, UNUSEDVERTEX);
    // Read the point coordinates.
    x = pointloop[0] = in->pointlist[coordindex++];
    y = pointloop[1] = in->pointlist[coordindex++];
    z = pointloop[2] = in->pointlist[coordindex++];
    // Read the point attributes. (Including point weights.)
    for (j = 0; j < in->numberofpointattributes; j++) {
      pointloop[3 + j] = in->pointattributelist[attribindex++];
    }
    // Read the point metric tensor.
    for (j = 0; j < in->numberofpointmtrs; j++) {
      pointloop[pointmtrindex + j] = in->pointmtrlist[mtrindex++];
    }
    if (b->weighted) { // -w option
      if (in->numberofpointattributes > 0) {
        // The first point attribute is its weight.
        //w = in->pointattributelist[in->numberofpointattributes * i];
        w = pointloop[3];
      } else {
        // No given weight available. Default choose the maximum
        //   absolute value among its coordinates.        
        w = fabs(x);
        if (w < fabs(y)) w = fabs(y);
        if (w < fabs(z)) w = fabs(z);
      }
      if (b->weighted_param == 0) {
        pointloop[3] = x * x + y * y + z * z - w; // Weighted DT.
      } else { // -w1 option
        pointloop[3] = w;  // Regular tetrahedralization.
      }
    }
    // Determine the smallest and largest x, y and z coordinates.
    if (i == 0) {
      xmin = xmax = x;
      ymin = ymax = y;
      zmin = zmax = z;
    } else {
      xmin = (x < xmin) ? x : xmin;
      xmax = (x > xmax) ? x : xmax;
      ymin = (y < ymin) ? y : ymin;
      ymax = (y > ymax) ? y : ymax;
      zmin = (z < zmin) ? z : zmin;
      zmax = (z > zmax) ? z : zmax;
    }
    if (b->psc) {
      // Read the geometry parameters.
      setpointgeomuv(pointloop, 0, in->pointparamlist[i].uv[0]);
      setpointgeomuv(pointloop, 1, in->pointparamlist[i].uv[1]);
      setpointgeomtag(pointloop, in->pointparamlist[i].tag);
      if (in->pointparamlist[i].type == 0) {
        setpointtype(pointloop, RIDGEVERTEX);
      } else if (in->pointparamlist[i].type == 1) {
        setpointtype(pointloop, FREESEGVERTEX);
      } else if (in->pointparamlist[i].type == 2) {
        setpointtype(pointloop, FREEFACETVERTEX);
      } else if (in->pointparamlist[i].type == 3) {
        setpointtype(pointloop, FREEVOLVERTEX);
      }
    }
  }

  // 'longest' is the largest possible edge length formed by input vertices.
  x = xmax - xmin;
  y = ymax - ymin;
  z = zmax - zmin;
  longest = sqrt(x * x + y * y + z * z);
  if (longest == 0.0) {
    printf("Error:  The point set is trivial.\n");
    terminatetetgen(this, 10);
  }
  // Two identical points are distinguished by 'minedgelength'.
  minedgelength = longest * b->epsilon;
}